

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<void_(pstore::gsl::span<int,_-1L>)>::TypedExpectation
          (TypedExpectation<void_(pstore::gsl::span<int,__1L>)> *this,
          FunctionMocker<void_(pstore::gsl::span<int,__1L>)> *owner,char *a_file,int a_line,
          string *a_source_text,ArgumentMatcherTuple *m)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_00199830;
  this->owner_ = owner;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<int,__1L>_>_>.
  super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<int,__1L>_>,_false>._M_head_impl.
  super_MatcherBase<pstore::gsl::span<int,__1L>_>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00198f58;
  pVVar1 = (m->super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<int,__1L>_>_>).
           super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<int,__1L>_>,_false>._M_head_impl
           .super_MatcherBase<pstore::gsl::span<int,__1L>_>.vtable_;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<int,__1L>_>_>.
  super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<int,__1L>_>,_false>._M_head_impl.
  super_MatcherBase<pstore::gsl::span<int,__1L>_>.vtable_ = pVVar1;
  pSVar2 = (m->super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<int,__1L>_>_>).
           super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<int,__1L>_>,_false>._M_head_impl
           .super_MatcherBase<pstore::gsl::span<int,__1L>_>.buffer_.shared;
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<int,__1L>_>_>.
  super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<int,__1L>_>,_false>._M_head_impl.
  super_MatcherBase<pstore::gsl::span<int,__1L>_>.buffer_.shared = pSVar2;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<int,__1L>_>_>.
  super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<int,__1L>_>,_false>._M_head_impl.
  super_MatcherBase<pstore::gsl::span<int,__1L>_>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00198ee8;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<pstore::gsl::span<int,__1L>_>_&>.vtable_
       = (VTable *)
         MatcherBase<std::tuple<pstore::gsl::span<int,-1l>>const&>::
         GetVTable<testing::internal::MatcherBase<std::tuple<pstore::gsl::span<int,-1l>>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
         ::kVTable;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<pstore::gsl::span<int,__1L>_>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001996c8;
  *(undefined8 *)&(this->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}